

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conspage.c
# Opt level: O2

void init_conspage(conspage *base,uint link)

{
  uint uVar1;
  uint uVar2;
  
  base->field_0xa = 0xf8;
  uVar2 = 0xfc000000;
  for (uVar1 = 0xfe; 8 < uVar1; uVar1 = uVar1 - 2) {
    *(uint *)((long)&base->cell6 + (ulong)(uVar1 ^ 6) * 2) = uVar2 ^ 0x6000000;
    uVar2 = uVar2 + 0xfe000000;
  }
  base[1].next_page = 0;
  base->field_0xb = 0x7c;
  base->next_page = link;
  return;
}

Assistant:

static void init_conspage(struct conspage *base, unsigned int link)
{
  ConsCell *cell;
  int j; /* DL-> int */

#ifdef TRACE2
  printf("TRACE: init_conspage()\n");
#endif

#ifdef NEWCDRCODING
  j = 254;
  base->next_cell = 6 ^ j;
  while (j > 8) {
    cell = (ConsCell *)((DLword *)base + (6 ^ j));
    cell->car_field = NIL_PTR;
    j -= 2;
    ((freecons *)cell)->next_free = (6 ^ j);
  }
  cell = (ConsCell *)((DLword *)base + (6 ^ j));
  cell->car_field = NIL_PTR;
  ((freecons *)cell)->next_free = 0;
  base->count = 124;
#else
  base->next_cell = j = 254;
  while (j != 0) {
    cell = (ConsCell *)((DLword *)base + j);
    cell->car_field = NIL_PTR;
    j -= 2;
    ((freecons *)cell)->next_free = j;
  }
  cell = (ConsCell *)((DLword *)base + j);
  cell->car_field = NIL_PTR;
  ((freecons *)cell)->next_free = 0;
  base->count = 127;
#endif /* NEWCDRCODING */
  base->next_page = link;

}